

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_info.h
# Opt level: O1

string __thiscall BlockInfo::ToString(BlockInfo *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long in_RSI;
  uint __len;
  string __str_2;
  string __str_1;
  string __str;
  long local_88;
  char *local_80 [2];
  undefined1 local_70 [8];
  char *local_68;
  string local_60;
  string local_58;
  string local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar8 = *(ulong *)(in_RSI + 0x28);
  uVar9 = 1;
  if (9 < uVar8) {
    uVar7 = uVar8;
    uVar2 = 4;
    do {
      uVar9 = uVar2;
      if (uVar7 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_0011fa82;
      }
      if (uVar7 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_0011fa82;
      }
      if (uVar7 < 10000) goto LAB_0011fa82;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      uVar2 = uVar9 + 4;
    } while (bVar1);
    uVar9 = uVar9 + 1;
  }
LAB_0011fa82:
  local_68 = (char *)std::string::_S_construct((ulong)uVar9,'\0',(allocator *)local_80);
  if (-1 < *(int *)(local_68 + -8)) {
    std::string::_M_leak_hard();
  }
  std::__detail::__to_chars_10_impl<unsigned_long_long>(local_68,*(uint *)(local_68 + -0x18),uVar8);
  plVar4 = (long *)std::string::insert((ulong)&local_68,(char *)0x0,0x127521);
  local_48 = *plVar4;
  *plVar4 = (long)std::string::insert;
  plVar4 = (long *)std::string::append((char *)&local_48,0x12802c);
  local_60._M_dataplus._M_p = (_Alloc_hider)*plVar4;
  *plVar4 = (long)std::string::insert;
  uVar8 = *(ulong *)(in_RSI + 0x30);
  uVar9 = 1;
  if (9 < uVar8) {
    uVar7 = uVar8;
    uVar2 = 4;
    do {
      uVar9 = uVar2;
      if (uVar7 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_0011fb63;
      }
      if (uVar7 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_0011fb63;
      }
      if (uVar7 < 10000) goto LAB_0011fb63;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      uVar2 = uVar9 + 4;
    } while (bVar1);
    uVar9 = uVar9 + 1;
  }
LAB_0011fb63:
  local_80[0] = (char *)std::string::_S_construct((ulong)uVar9,'\0',(allocator *)&local_88);
  if (-1 < *(int *)(local_80[0] + -8)) {
    std::string::_M_leak_hard();
  }
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            (local_80[0],*(uint *)(local_80[0] + -0x18),uVar8);
  uVar8 = *(long *)(local_80[0] + -0x18) + *(long *)((long)local_60._M_dataplus._M_p + -0x18);
  if ((*(ulong *)((long)local_60._M_dataplus._M_p + -0x10) < uVar8) &&
     (uVar8 <= *(ulong *)(local_80[0] + -0x10))) {
    plVar4 = (long *)std::string::insert((ulong)local_80,(string *)0x0,(ulong)&local_60,0);
  }
  else {
    plVar4 = (long *)std::string::append(&local_60);
  }
  local_40 = *plVar4;
  *plVar4 = (long)std::string::insert;
  plVar4 = (long *)std::string::append((char *)&local_40,0x12802c);
  local_58._M_dataplus._M_p = (_Alloc_hider)*plVar4;
  *plVar4 = (long)std::string::insert;
  uVar9 = *(uint *)(in_RSI + 0x38);
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  __len = 1;
  if (9 < uVar2) {
    uVar8 = (ulong)uVar2;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0011fc65;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0011fc65;
      }
      if (uVar6 < 10000) goto LAB_0011fc65;
      uVar8 = uVar8 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_0011fc65:
  local_88 = std::string::_S_construct
                       ((ulong)(__len + -((int)uVar9 >> 0x1f)),'-',(allocator *)local_70);
  if (-1 < *(int *)(local_88 + -8)) {
    std::string::_M_leak_hard();
  }
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uint)-((int)uVar9 >> 0x1f) + local_88),__len,uVar2);
  uVar8 = *(long *)(local_88 + -0x18) + *(long *)((long)local_58._M_dataplus._M_p + -0x18);
  if ((*(ulong *)((long)local_58._M_dataplus._M_p + -0x10) < uVar8) &&
     (uVar8 <= *(ulong *)(local_88 + -0x10))) {
    plVar4 = (long *)std::string::insert((ulong)&local_88,(string *)0x0,(ulong)&local_58,0);
  }
  else {
    plVar4 = (long *)std::string::append(&local_58);
  }
  local_38 = *plVar4;
  *plVar4 = (long)std::string::insert;
  plVar4 = (long *)std::string::append((char *)&local_38,0x12802d);
  local_50._M_dataplus._M_p = (_Alloc_hider)*plVar4;
  *plVar4 = (long)std::string::insert;
  DatanodeInfo::ToString((DatanodeInfo *)local_70);
  if ((*(_func_int **)((long)local_50._M_dataplus._M_p + -0x10) <
       *(_func_int **)((long)local_70 + -0x18) + *(long *)((long)local_50._M_dataplus._M_p + -0x18))
     && (*(_func_int **)((long)local_70 + -0x18) +
         *(long *)((long)local_50._M_dataplus._M_p + -0x18) <=
         *(_func_int **)((long)local_70 + -0x10))) {
    puVar5 = (undefined8 *)std::string::insert((ulong)local_70,(string *)0x0,(ulong)&local_50,0);
  }
  else {
    puVar5 = (undefined8 *)std::string::append(&local_50);
  }
  this->_vptr_BlockInfo = (_func_int **)*puVar5;
  *puVar5 = std::string::insert;
  std::string::_Rep::_M_dispose((allocator *)((long)local_70 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)((long)local_50._M_dataplus._M_p + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_38 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_88 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)((long)local_58._M_dataplus._M_p + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_40 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_80[0] + -0x18));
  std::string::_Rep::_M_dispose((allocator *)((long)local_60._M_dataplus._M_p + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_48 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_68 + -0x18));
  return (string)(_Alloc_hider)this;
}

Assistant:

string ToString() const {
    return "BlockInfo:: " + to_string(lba_) + ", " + to_string(addr_) + ", " +
           to_string(length_) + " " + datanode_info_.ToString();
  }